

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.h
# Opt level: O3

u32 __thiscall HighsMatrixColoring::color(HighsMatrixColoring *this,double value)

{
  bool bVar1;
  const_iterator __pos;
  iterator iVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  double dVar5;
  double local_10;
  unsigned_long local_8;
  
  p_Var3 = (this->colorMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  __pos._M_node = &(this->colorMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    dVar5 = value - this->tolerance;
    iVar2._M_node = __pos._M_node;
    do {
      bVar4 = dVar5 != *(double *)(p_Var3 + 1);
      bVar1 = *(double *)(p_Var3 + 1) <= dVar5;
      if (!bVar1 || !bVar4) {
        iVar2._M_node = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar1 && bVar4];
    } while (p_Var3 != (_Base_ptr)0x0);
    bVar4 = iVar2._M_node != __pos._M_node;
    __pos._M_node = iVar2._M_node;
    if ((bVar4) && (*(double *)(iVar2._M_node + 1) <= this->tolerance + value)) goto LAB_00300eb5;
  }
  local_8 = (this->colorMap)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
  local_10 = value;
  iVar2 = std::
          _Rb_tree<double,std::pair<double_const,unsigned_int>,std::_Select1st<std::pair<double_const,unsigned_int>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_int>>>
          ::_M_emplace_hint_unique<double&,unsigned_long>
                    ((_Rb_tree<double,std::pair<double_const,unsigned_int>,std::_Select1st<std::pair<double_const,unsigned_int>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_int>>>
                      *)this,__pos,&local_10,&local_8);
LAB_00300eb5:
  return *(u32 *)&iVar2._M_node[1]._M_parent;
}

Assistant:

u32 color(double value) {
    // iterator points to smallest element in map which fulfills key >= value -
    // tolerance
    auto it = colorMap.lower_bound(value - tolerance);
    // check if there is no such element, or if this element has a key value +
    // tolerance in which case we create a new color and store it with the key
    // value
    if (it == colorMap.end() || it->first > value + tolerance)
      it = colorMap.emplace_hint(it, value, colorMap.size() + 1);
    return it->second;
  }